

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall soplex::CLUFactor<double>::forestPackColumns(CLUFactor<double> *this)

{
  Col *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  pointer pdVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  Dring *pDVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  
  pCVar1 = &(this->u).col;
  pDVar10 = (this->u).col.list.next;
  piVar5 = (this->u).col.max;
  if ((Col *)pDVar10 == pCVar1) {
    uVar12 = 0;
  }
  else {
    pdVar6 = (this->u).col.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->u).col.idx;
    piVar8 = (this->u).col.len;
    piVar9 = (this->u).col.start;
    uVar13 = 0;
    do {
      iVar2 = pDVar10->idx;
      if (piVar9[iVar2] != (int)uVar13) goto LAB_001df98b;
      iVar3 = piVar8[iVar2];
      uVar12 = (int)uVar13 + iVar3;
      uVar13 = (ulong)uVar12;
      piVar5[iVar2] = iVar3;
      pDVar10 = pDVar10->next;
    } while ((Col *)pDVar10 != pCVar1);
  }
LAB_001df9d6:
  (this->u).col.used = uVar12;
  piVar5[this->thedim] = 0;
  return;
LAB_001df98b:
  do {
    iVar2 = pDVar10->idx;
    iVar3 = piVar9[iVar2];
    lVar11 = (long)iVar3;
    piVar9[iVar2] = (int)uVar13;
    iVar4 = piVar8[iVar2];
    piVar5[iVar2] = iVar4;
    if (0 < iVar4) {
      uVar13 = (ulong)(int)uVar13;
      do {
        pdVar6[uVar13] = pdVar6[lVar11];
        piVar7[uVar13] = piVar7[lVar11];
        uVar13 = uVar13 + 1;
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar4 + iVar3);
    }
    uVar12 = (uint)uVar13;
    pDVar10 = pDVar10->next;
  } while ((Col *)pDVar10 != pCVar1);
  goto LAB_001df9d6;
}

Assistant:

void CLUFactor<R>::forestPackColumns()
{
   int n, i, j, colno;
   Dring* ring, *list;

   R* cval = u.col.val.data();
   int* cidx = u.col.idx;
   int* clen = u.col.len;
   int* cmax = u.col.max;
   int* cbeg = u.col.start;

   n = 0;
   list = &u.col.list;

   for(ring = list->next; ring != list; ring = ring->next)
   {
      colno = ring->idx;

      if(cbeg[colno] != n)
      {
         do
         {
            colno = ring->idx;
            i = cbeg[colno];
            cbeg[colno] = n;
            cmax[colno] = clen[colno];
            j = i + clen[colno];

            for(; i < j; ++i)
            {
               cval[n] = cval[i];
               cidx[n++] = cidx[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += clen[colno];

      cmax[colno] = clen[colno];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}